

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::addRandomImplMaxTest(TestCaseGroup *root)

{
  ImplMaxDrawBuffersIndexedTest *this;
  Context *context;
  undefined4 local_14;
  int i;
  TestCaseGroup *root_local;
  
  for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
    this = (ImplMaxDrawBuffersIndexedTest *)operator_new(0x80);
    context = TestCaseGroup::getContext(root);
    ImplMaxDrawBuffersIndexedTest::ImplMaxDrawBuffersIndexedTest(this,context,local_14);
    tcu::TestNode::addChild((TestNode *)root,(TestNode *)this);
  }
  return;
}

Assistant:

void addRandomImplMaxTest (TestCaseGroup* root)
{
	for (int i = 0; i < 20; i++)
		root->addChild(new ImplMaxDrawBuffersIndexedTest(root->getContext(), i));
}